

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall
QListWidgetItem::QListWidgetItem(QListWidgetItem *this,QListWidget *listview,int type)

{
  long lVar1;
  int row;
  QListWidgetItemPrivate *pQVar2;
  QListModel *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QListWidgetItem = (_func_int **)&PTR__QListWidgetItem_0081c3e0;
  this->rtti = type;
  this->view = listview;
  pQVar2 = (QListWidgetItemPrivate *)operator_new(0x28);
  pQVar2->q = this;
  (pQVar2->values).d.d = (Data *)0x0;
  (pQVar2->values).d.ptr = (QWidgetItemData *)0x0;
  (pQVar2->values).d.size = 0;
  pQVar2->theid = -1;
  this->d = pQVar2;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x35;
  this_00 = listModel(this);
  if (this_00 != (QListModel *)0x0) {
    row = (**(code **)(*(long *)this_00 + 0x78))(this_00);
    QListModel::insert(this_00,row,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem::QListWidgetItem(QListWidget *listview, int type)
    : rtti(type), view(listview), d(new QListWidgetItemPrivate(this)),
      itemFlags(Qt::ItemIsSelectable
                |Qt::ItemIsUserCheckable
                |Qt::ItemIsEnabled
                |Qt::ItemIsDragEnabled)
{
    if (QListModel *model = listModel())
        model->insert(model->rowCount(), this);
}